

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

void __thiscall
pbrt::
TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
::TaggedPointer<pbrt::DielectricMaterial>
          (TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
           *this,DielectricMaterial *ptr)

{
  uint16_t type;
  uintptr_t iptr;
  DielectricMaterial *ptr_local;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  *this_local;
  
  this->bits = 0;
  this->bits = (ulong)ptr | 0x4000000000000;
  return;
}

Assistant:

PBRT_CPU_GPU TaggedPointer(T *ptr) {
        uintptr_t iptr = reinterpret_cast<uintptr_t>(ptr);
        // Reminder: if this CHECK hits, it's likely that the class
        // involved needs an alignas(8).
        DCHECK_EQ(iptr & ptrMask, iptr);
        constexpr uint16_t type = TypeIndex<T>();
        bits = iptr | ((uintptr_t)type << tagShift);
    }